

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.h
# Opt level: O1

uint __thiscall
o3dgc::Arithmetic_Codec::ExpGolombDecode
          (Arithmetic_Codec *this,int k,Static_Bit_Model *bModel0,Adaptive_Bit_Model *bModel1)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = 0;
  do {
    iVar6 = k;
    uVar1 = decode(this,bModel1);
    iVar3 = 1 << ((byte)iVar6 & 0x1f);
    if (uVar1 != 1) {
      iVar3 = 0;
    }
    k = (uint)(uVar1 == 1) + iVar6;
    iVar5 = iVar5 + iVar3;
  } while (uVar1 != 0);
  if (k == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      iVar6 = iVar6 + -1;
      uVar2 = decode(this,bModel0);
      uVar4 = 1 << ((byte)iVar6 & 0x1f);
      if (uVar2 != 1) {
        uVar4 = 0;
      }
      uVar1 = uVar1 | uVar4;
    } while (iVar6 != 0);
  }
  return uVar1 + iVar5;
}

Assistant:

unsigned   ExpGolombDecode(int k,
                               Static_Bit_Model & bModel0,
                               Adaptive_Bit_Model & bModel1)
               {
                   unsigned int l;
                   int symbol = 0;
                   int binary_symbol = 0;
                   do
                   {
                       l=decode(bModel1);
                       if (l==1)
                       {
                           symbol += (1<<k);
                           k++;
                        }
                   }
                   while (l!=0);
                   while (k--)                             //next binary part
                   if (decode(bModel0)==1)
                   {
                       binary_symbol |= (1<<k);
                   }
                   return (unsigned int) (symbol+binary_symbol);
                }